

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase54::~TestCase54(TestCase54 *this)

{
  TestCase54 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Endian, TwoBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint16_t>* vals = reinterpret_cast<WireValue<uint16_t>*>(bytes);

  EXPECT_EQ(0x3412, vals[0].get());
  EXPECT_EQ(0x7856, vals[1].get());

  vals[0].set(0x2345);
  vals[1].set(0x6789);

  EXPECT_EQ(0x45, bytes[0]);
  EXPECT_EQ(0x23, bytes[1]);
  EXPECT_EQ(0x89, bytes[2]);
  EXPECT_EQ(0x67, bytes[3]);
}